

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RegexParser.cpp
# Opt level: O2

Node * __thiscall
UnifiedRegex::Parser<NullTerminatedUnicodeEncodingPolicy,_false>::NewLoopNode
          (Parser<NullTerminatedUnicodeEncodingPolicy,_false> *this,CharCount lower,
          CharCountOrFlag upper,bool isGreedy,Node *body)

{
  LoopNode *this_00;
  
  this_00 = (LoopNode *)body;
  if (upper != 1 || lower != 1) {
    if (upper == 0 && lower == 0) {
      this_00 = (LoopNode *)new<Memory::ArenaAllocator>(0x38,this->ctAllocator,0x35916e);
      SimpleNode::SimpleNode((SimpleNode *)this_00,Empty);
    }
    else {
      this_00 = (LoopNode *)new<Memory::ArenaAllocator>(0x50,this->ctAllocator,0x35916e);
      LoopNode::LoopNode(this_00,lower,upper,isGreedy,body);
    }
  }
  return &this_00->super_Node;
}

Assistant:

Node* Parser<P, IsLiteral>::NewLoopNode(CharCount lower, CharCountOrFlag upper, bool isGreedy, Node* body)
    {
        //
        // NOTE: We'd like to represent r? (i.e. r{0,1}) as r|<empty> since the loop representation has high overhead.
        //       HOWEVER if r contains a group definition and could match empty then we must execute as a loop
        //       so that group bindings are correctly reset on no progress (e.g.: /(a*)?/.exec("")). Thus we defer
        //       this optimization until pass 4 of the optimizer, at which point we know whether r could match empty.
        //
        if (lower == 1 && upper == 1)
            return body;
        else if (lower == 0 && upper == 0)
            // Loop is equivalent to empty. If the loop body contains group definitions they will have already been
            // counted towards the overall number of groups. The matcher will initialize their contents to
            // undefined, and since the loop body would never execute the inner groups could never be updated from
            // undefined.
            return Anew(ctAllocator, SimpleNode, Node::Empty);
        else
            return Anew(ctAllocator, LoopNode, lower, upper, isGreedy, body);
    }